

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O2

void __thiscall antlr::ASTPair::advanceChildToEnd(ASTPair *this)

{
  ASTRef *pAVar1;
  RefAST *this_00;
  AST *pAVar2;
  ASTRefCount<antlr::AST> local_20;
  
  pAVar1 = (this->child).ref;
  if ((pAVar1 != (ASTRef *)0x0) && (pAVar2 = pAVar1->ptr, pAVar2 != (AST *)0x0)) {
    this_00 = &this->child;
    while ((*pAVar2->_vptr_AST[0xe])(&local_20), local_20.ref != (ASTRef *)0x0) {
      pAVar2 = (local_20.ref)->ptr;
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
      if (pAVar2 == (AST *)0x0) {
        return;
      }
      (*this_00->ref->ptr->_vptr_AST[0xe])(&local_20);
      ASTRefCount<antlr::AST>::operator=(this_00,&local_20);
      ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
      pAVar2 = this_00->ref->ptr;
    }
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_20);
  }
  return;
}

Assistant:

operator T* ()  const { return ref ? static_cast<T*>(ref->ptr) : 0; }